

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O1

void printf_test(void)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  bool bVar4;
  array_container_t *container;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  char *unaff_R15;
  
  container = array_container_create();
  pcVar7 = "B";
  _assert_true((unsigned_long)container,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x17);
  iVar3 = container->cardinality;
  if (((long)iVar3 == 0) || ((iVar3 != 0x7fffffff && (container->array[(long)iVar3 + -1] == 0)))) {
    if (iVar3 == container->capacity) {
      array_container_grow(container,container->capacity + 1,true);
    }
    iVar3 = container->cardinality;
    container->cardinality = iVar3 + 1;
    container->array[iVar3] = 1;
  }
  else {
    iVar5 = iVar3 + -1;
    uVar6 = 0;
    do {
      if (iVar5 < (int)uVar6) {
        unaff_R15 = (char *)(ulong)~uVar6;
        break;
      }
      uVar8 = uVar6 + iVar5 >> 1;
      sVar1 = *(short *)((long)container->array + (ulong)(uVar6 + iVar5 & 0xfffffffe));
      if (sVar1 == 1) {
        bVar4 = false;
        pcVar7 = (char *)(ulong)uVar8;
      }
      else {
        if (sVar1 == 0) {
          uVar6 = uVar8 + 1;
        }
        else {
          iVar5 = uVar8 - 1;
        }
        bVar4 = true;
        pcVar7 = (char *)((ulong)pcVar7 & 0xffffffff);
      }
      unaff_R15 = pcVar7;
    } while (bVar4);
    if ((iVar3 != 0x7fffffff) && ((int)(uint)unaff_R15 < 0)) {
      if (iVar3 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      uVar6 = ~(uint)unaff_R15;
      unaff_R15 = (char *)(ulong)uVar6;
      memmove(container->array + (long)(unaff_R15 + 1),container->array + (long)unaff_R15,
              (long)(int)(iVar3 - uVar6) * 2);
      container->array[(long)unaff_R15] = 1;
      container->cardinality = container->cardinality + 1;
    }
  }
  iVar3 = container->cardinality;
  if (((long)iVar3 == 0) || ((iVar3 != 0x7fffffff && (container->array[(long)iVar3 + -1] < 2)))) {
    if (iVar3 == container->capacity) {
      array_container_grow(container,container->capacity + 1,true);
    }
    iVar3 = container->cardinality;
    container->cardinality = iVar3 + 1;
    container->array[iVar3] = 2;
  }
  else {
    iVar5 = iVar3 + -1;
    uVar6 = 0;
    do {
      if (iVar5 < (int)uVar6) {
        unaff_R15 = (char *)(ulong)~uVar6;
        break;
      }
      uVar8 = uVar6 + iVar5 >> 1;
      uVar2 = *(ushort *)((long)container->array + (ulong)(uVar6 + iVar5 & 0xfffffffe));
      if (uVar2 < 2) {
        uVar6 = uVar8 + 1;
        bVar4 = true;
      }
      else if (uVar2 == 2) {
        bVar4 = false;
        unaff_R15 = (char *)(ulong)uVar8;
      }
      else {
        iVar5 = uVar8 - 1;
        bVar4 = true;
      }
    } while (bVar4);
    if ((iVar3 != 0x7fffffff) && ((int)(uint)unaff_R15 < 0)) {
      if (iVar3 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      uVar6 = ~(uint)unaff_R15;
      unaff_R15 = (char *)(ulong)uVar6;
      memmove(container->array + (long)(unaff_R15 + 1),container->array + (long)unaff_R15,
              (long)(int)(iVar3 - uVar6) * 2);
      container->array[(long)unaff_R15] = 2;
      container->cardinality = container->cardinality + 1;
    }
  }
  iVar3 = container->cardinality;
  if (((long)iVar3 == 0) || ((iVar3 != 0x7fffffff && (container->array[(long)iVar3 + -1] < 3)))) {
    if (iVar3 == container->capacity) {
      array_container_grow(container,container->capacity + 1,true);
    }
    iVar3 = container->cardinality;
    container->cardinality = iVar3 + 1;
    container->array[iVar3] = 3;
  }
  else {
    iVar5 = iVar3 + -1;
    uVar6 = 0;
    do {
      if (iVar5 < (int)uVar6) {
        unaff_R15 = (char *)(ulong)~uVar6;
        break;
      }
      uVar8 = uVar6 + iVar5 >> 1;
      uVar2 = *(ushort *)((long)container->array + (ulong)(uVar6 + iVar5 & 0xfffffffe));
      if (uVar2 < 3) {
        uVar6 = uVar8 + 1;
        bVar4 = true;
      }
      else if (uVar2 == 3) {
        bVar4 = false;
        unaff_R15 = (char *)(ulong)uVar8;
      }
      else {
        iVar5 = uVar8 - 1;
        bVar4 = true;
      }
    } while (bVar4);
    if ((iVar3 != 0x7fffffff) && ((int)(uint)unaff_R15 < 0)) {
      if (iVar3 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      uVar6 = ~(uint)unaff_R15;
      unaff_R15 = (char *)(ulong)uVar6;
      memmove(container->array + (long)(unaff_R15 + 1),container->array + (long)unaff_R15,
              (long)(int)(iVar3 - uVar6) * 2);
      container->array[(long)unaff_R15] = 3;
      container->cardinality = container->cardinality + 1;
    }
  }
  iVar3 = container->cardinality;
  if (((long)iVar3 == 0) || ((iVar3 != 0x7fffffff && (container->array[(long)iVar3 + -1] < 10)))) {
    if (iVar3 == container->capacity) {
      array_container_grow(container,container->capacity + 1,true);
    }
    iVar3 = container->cardinality;
    container->cardinality = iVar3 + 1;
    container->array[iVar3] = 10;
  }
  else {
    iVar5 = iVar3 + -1;
    uVar6 = 0;
    do {
      if (iVar5 < (int)uVar6) {
        unaff_R15 = (char *)(ulong)~uVar6;
        break;
      }
      uVar8 = uVar6 + iVar5 >> 1;
      uVar2 = *(ushort *)((long)container->array + (ulong)(uVar6 + iVar5 & 0xfffffffe));
      if (uVar2 < 10) {
        uVar6 = uVar8 + 1;
        bVar4 = true;
      }
      else if (uVar2 == 10) {
        bVar4 = false;
        unaff_R15 = (char *)(ulong)uVar8;
      }
      else {
        iVar5 = uVar8 - 1;
        bVar4 = true;
      }
    } while (bVar4);
    if ((iVar3 != 0x7fffffff) && ((int)(uint)unaff_R15 < 0)) {
      if (iVar3 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      uVar6 = ~(uint)unaff_R15;
      unaff_R15 = (char *)(ulong)uVar6;
      memmove(container->array + (long)(unaff_R15 + 1),container->array + (long)unaff_R15,
              (long)(int)(iVar3 - uVar6) * 2);
      container->array[(long)unaff_R15] = 10;
      container->cardinality = container->cardinality + 1;
    }
  }
  iVar3 = container->cardinality;
  if (((long)iVar3 == 0) || ((iVar3 != 0x7fffffff && (container->array[(long)iVar3 + -1] < 10000))))
  {
    if (iVar3 == container->capacity) {
      array_container_grow(container,container->capacity + 1,true);
    }
    iVar3 = container->cardinality;
    container->cardinality = iVar3 + 1;
    container->array[iVar3] = 10000;
  }
  else {
    iVar5 = iVar3 + -1;
    uVar6 = 0;
    do {
      if (iVar5 < (int)uVar6) {
        uVar8 = ~uVar6;
        break;
      }
      uVar8 = uVar6 + iVar5 >> 1;
      uVar2 = *(ushort *)((long)container->array + (ulong)(uVar6 + iVar5 & 0xfffffffe));
      if (uVar2 < 10000) {
        uVar6 = uVar8 + 1;
        bVar4 = true;
      }
      else if (uVar2 == 10000) {
        bVar4 = false;
        unaff_R15 = (char *)(ulong)uVar8;
      }
      else {
        iVar5 = uVar8 - 1;
        bVar4 = true;
      }
      uVar8 = (uint)unaff_R15;
    } while (bVar4);
    if ((iVar3 != 0x7fffffff) && ((int)uVar8 < 0)) {
      if (iVar3 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      uVar8 = ~uVar8;
      memmove(container->array + (ulong)uVar8 + 1,container->array + uVar8,
              (long)(int)(iVar3 - uVar8) * 2);
      container->array[uVar8] = 10000;
      container->cardinality = container->cardinality + 1;
    }
  }
  array_container_printf(container);
  putchar(10);
  array_container_free(container);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    array_container_t* B = array_container_create();
    assert_non_null(B);

    array_container_add(B, 1U);
    array_container_add(B, 2U);
    array_container_add(B, 3U);
    array_container_add(B, 10U);
    array_container_add(B, 10000U);

    array_container_printf(B);
    printf("\n");

    array_container_free(B);
}